

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsrtExternalArrayBuffer.cpp
# Opt level: O3

ArrayBufferDetachedStateBase * __thiscall
Js::JsrtExternalArrayBuffer::CreateDetachedState
          (JsrtExternalArrayBuffer *this,RefCountedBuffer *buffer,uint32 bufferLength)

{
  HeapAllocator *alloc;
  JsrtExternalArrayBufferDetachedState *this_00;
  undefined1 local_58 [8];
  TrackAllocData data;
  
  local_58 = (undefined1  [8])&JsrtExternalArrayBufferDetachedState::typeinfo;
  data.typeinfo = (type_info *)0x0;
  data.plusSize = 0xffffffffffffffff;
  data.count = (size_t)anon_var_dwarf_3d0cb3;
  data.filename._0_4_ = 0x2c;
  alloc = Memory::HeapAllocator::TrackAllocInfo
                    (&Memory::HeapAllocator::Instance,(TrackAllocData *)local_58);
  this_00 = (JsrtExternalArrayBufferDetachedState *)new<Memory::HeapAllocator>(0x30,alloc,0x2ff150);
  JsrtExternalArrayBufferDetachedState::JsrtExternalArrayBufferDetachedState
            (this_00,buffer,bufferLength,this->finalizeCallback,this->callbackState);
  return (ArrayBufferDetachedStateBase *)this_00;
}

Assistant:

ArrayBufferDetachedStateBase* JsrtExternalArrayBuffer::CreateDetachedState(RefCountedBuffer* buffer, DECLSPEC_GUARD_OVERFLOW uint32 bufferLength)
    {
        return HeapNew(JsrtExternalArrayBufferDetachedState, buffer, bufferLength, finalizeCallback, callbackState);
    }